

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rotating_log.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_32e221::mock_file_system_traits::mock_file_system_traits
          (mock_file_system_traits *this)

{
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)this);
  (this->gmock01_exists_32).super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_002701a8;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->gmock01_unlink_33).super_UntypedFunctionMockerBase);
  (this->gmock01_unlink_33).super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_002702a8;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->gmock02_rename_34).super_UntypedFunctionMockerBase);
  (this->gmock02_rename_34).super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_00270310;
  return;
}

Assistant:

mock_file_system_traits () {}